

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuPair.c
# Opt level: O2

void Fxu_PairCanonicize2(Fxu_Cube **ppCube1,Fxu_Cube **ppCube2)

{
  Fxu_Cube *pFVar1;
  
  pFVar1 = *ppCube1;
  if ((*ppCube2)->iCube < pFVar1->iCube) {
    *ppCube1 = *ppCube2;
    *ppCube2 = pFVar1;
  }
  return;
}

Assistant:

void Fxu_PairCanonicize2( Fxu_Cube ** ppCube1, Fxu_Cube ** ppCube2 )
{
    Fxu_Cube * pCubeTemp;
    // canonicize the pair by ordering the cubes
    if ( (*ppCube1)->iCube > (*ppCube2)->iCube )
    { // swap the cubes
        pCubeTemp = *ppCube1;
        *ppCube1  = *ppCube2;
        *ppCube2  = pCubeTemp;
    }
}